

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

size_t __thiscall lan::safe_file::length(safe_file *this)

{
  int iVar1;
  ulong in_RAX;
  FILE *__stream;
  size_t sVar2;
  ulong uStack_28;
  char data_c;
  
  uStack_28 = in_RAX;
  close_fd(this);
  __stream = fopen((this->filename)._M_dataplus._M_p,"r");
  this->file = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    sVar2 = 0;
  }
  else {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    sVar2 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      fread(&data_c,1,1,(FILE *)this->file);
      sVar2 = sVar2 + 1;
      __stream = (FILE *)this->file;
    }
  }
  return sVar2;
}

Assistant:

size_t safe_file::length(){
        close_fd();
        size_t length = 0;
        if((file = fopen(filename.data(), "r"))){
            char data_c = 0;
            while(!feof(file)){
                fread(&data_c, sizeof(char), 1, file); length++;
            }
        } return length;
    }